

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

void __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::BplusTree
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          string *str,uint cache_size)

{
  string asStack_38 [32];
  
  std::__cxx11::string::string(asStack_38,(string *)str);
  init(this,(EVP_PKEY_CTX *)asStack_38);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

BplusTree(std::string str , unsigned int cache_size) {
            init(str , cache_size);
        }